

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O0

void beagle::cpu::transposeSquareMatrix<float>(float *mat,int size)

{
  float fVar1;
  float tmp;
  int j;
  int i;
  int size_local;
  float *mat_local;
  
  for (i = 0; j = i, i < size + -1; i = i + 1) {
    while (j = j + 1, j < size) {
      fVar1 = mat[i * size + j];
      mat[i * size + j] = mat[j * size + i];
      mat[j * size + i] = fVar1;
    }
  }
  return;
}

Assistant:

void transposeSquareMatrix(REALTYPE* mat,
                           int size) {
    for (int i = 0; i < size - 1; i++) {
        for (int j = i + 1; j < size; j++) {
            REALTYPE tmp = mat[i * size + j];
            mat[i * size + j] = mat[j * size + i];
            mat[j * size + i] = tmp;
        }
    }
}